

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_zip64.c
# Opt level: O0

void verify_file0_seek(archive *a)

{
  int iVar1;
  mode_t mVar2;
  char *v2;
  la_int64_t v2_00;
  la_ssize_t v2_01;
  undefined1 local_28 [8];
  char data [16];
  archive_entry *ae;
  archive *a_local;
  
  iVar1 = archive_read_next_header(a,(archive_entry **)(data + 8));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'%',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  v2 = archive_entry_pathname((archive_entry *)data._8_8_);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
             ,L'&',"-","\"-\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode((archive_entry *)data._8_8_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'\'',0x81b0,"AE_IFREG | 0660",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  v2_00 = archive_entry_size((archive_entry *)data._8_8_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'(',6,"6",v2_00,"archive_entry_size(ae)",(void *)0x0);
  v2_01 = archive_read_data(a,local_28,0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L',',6,"6",v2_01,"archive_read_data(a, data, 16)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'-',local_28,"data","file0\n","\"file0\\x0a\"",6,"6",(void *)0x0);
  iVar1 = archive_read_next_header(a,(archive_entry **)(data + 8));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'0',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",a);
  return;
}

Assistant:

static void
verify_file0_seek(struct archive *a)
{
	struct archive_entry *ae;

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("-", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0660, archive_entry_mode(ae));
	assertEqualInt(6, archive_entry_size(ae));
#ifdef HAVE_ZLIB_H
	{
		char data[16];
		assertEqualIntA(a, 6, archive_read_data(a, data, 16));
		assertEqualMem(data, "file0\x0a", 6);
	}
#endif
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}